

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipher.c
# Opt level: O0

int mbedtls_cipher_check_tag(mbedtls_cipher_context_t *ctx,uchar *tag,size_t tag_len)

{
  int iVar1;
  uchar local_38 [4];
  int ret;
  uchar check_tag [16];
  size_t tag_len_local;
  uchar *tag_local;
  mbedtls_cipher_context_t *ctx_local;
  
  if (ctx->cipher_info == (mbedtls_cipher_info_t *)0x0) {
    ctx_local._4_4_ = -0x6100;
  }
  else if (ctx->operation == MBEDTLS_DECRYPT) {
    check_tag._8_8_ = tag_len;
    if (ctx->cipher_info->mode == MBEDTLS_MODE_GCM) {
      if (tag_len < 0x11) {
        ctx_local._4_4_ =
             mbedtls_gcm_finish((mbedtls_gcm_context *)ctx->cipher_ctx,local_38,tag_len);
        if (ctx_local._4_4_ == 0) {
          iVar1 = mbedtls_constant_time_memcmp(tag,local_38,check_tag._8_8_);
          if (iVar1 == 0) {
            ctx_local._4_4_ = 0;
          }
          else {
            ctx_local._4_4_ = -0x6300;
          }
        }
      }
      else {
        ctx_local._4_4_ = -0x6100;
      }
    }
    else if (ctx->cipher_info->type == MBEDTLS_CIPHER_CHACHA20_POLY1305) {
      if (tag_len == 0x10) {
        ctx_local._4_4_ =
             mbedtls_chachapoly_finish((mbedtls_chachapoly_context *)ctx->cipher_ctx,local_38);
        if (ctx_local._4_4_ == 0) {
          iVar1 = mbedtls_constant_time_memcmp(tag,local_38,check_tag._8_8_);
          if (iVar1 == 0) {
            ctx_local._4_4_ = 0;
          }
          else {
            ctx_local._4_4_ = -0x6300;
          }
        }
      }
      else {
        ctx_local._4_4_ = -0x6100;
      }
    }
    else {
      ctx_local._4_4_ = 0;
    }
  }
  else {
    ctx_local._4_4_ = -0x6100;
  }
  return ctx_local._4_4_;
}

Assistant:

int mbedtls_cipher_check_tag( mbedtls_cipher_context_t *ctx,
                      const unsigned char *tag, size_t tag_len )
{
    unsigned char check_tag[16];
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;

    CIPHER_VALIDATE_RET( ctx != NULL );
    CIPHER_VALIDATE_RET( tag_len == 0 || tag != NULL );
    if( ctx->cipher_info == NULL )
        return( MBEDTLS_ERR_CIPHER_BAD_INPUT_DATA );

    if( MBEDTLS_DECRYPT != ctx->operation )
    {
        return( MBEDTLS_ERR_CIPHER_BAD_INPUT_DATA );
    }

#if defined(MBEDTLS_USE_PSA_CRYPTO)
    if( ctx->psa_enabled == 1 )
    {
        /* While PSA Crypto has an API for multipart
         * operations, we currently don't make it
         * accessible through the cipher layer. */
        return( MBEDTLS_ERR_CIPHER_FEATURE_UNAVAILABLE );
    }
#endif /* MBEDTLS_USE_PSA_CRYPTO */

#if defined(MBEDTLS_GCM_C)
    if( MBEDTLS_MODE_GCM == ctx->cipher_info->mode )
    {
        if( tag_len > sizeof( check_tag ) )
            return( MBEDTLS_ERR_CIPHER_BAD_INPUT_DATA );

        if( 0 != ( ret = mbedtls_gcm_finish(
                       (mbedtls_gcm_context *) ctx->cipher_ctx,
                       check_tag, tag_len ) ) )
        {
            return( ret );
        }

        /* Check the tag in "constant-time" */
        if( mbedtls_constant_time_memcmp( tag, check_tag, tag_len ) != 0 )
            return( MBEDTLS_ERR_CIPHER_AUTH_FAILED );

        return( 0 );
    }
#endif /* MBEDTLS_GCM_C */

#if defined(MBEDTLS_CHACHAPOLY_C)
    if ( MBEDTLS_CIPHER_CHACHA20_POLY1305 == ctx->cipher_info->type )
    {
        /* Don't allow truncated MAC for Poly1305 */
        if ( tag_len != sizeof( check_tag ) )
            return( MBEDTLS_ERR_CIPHER_BAD_INPUT_DATA );

        ret = mbedtls_chachapoly_finish(
            (mbedtls_chachapoly_context*) ctx->cipher_ctx, check_tag );
        if ( ret != 0 )
        {
            return( ret );
        }

        /* Check the tag in "constant-time" */
        if( mbedtls_constant_time_memcmp( tag, check_tag, tag_len ) != 0 )
            return( MBEDTLS_ERR_CIPHER_AUTH_FAILED );

        return( 0 );
    }
#endif /* MBEDTLS_CHACHAPOLY_C */

    return( 0 );
}